

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_CLZ(DisasContext_conflict1 *s,arg_rpr_esz *a)

{
  _Bool _Var1;
  arg_rpr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  _Var1 = do_zpz_ool(s,a,trans_CLZ::fns[a->esz]);
  return _Var1;
}

Assistant:

static bool trans_CLZ(DisasContext *s, arg_CLZ *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_5) {
        return false;
    }
    tmp = load_reg(s, a->rm);
    tcg_gen_clzi_i32(tcg_ctx, tmp, tmp, 32);
    store_reg(s, a->rd, tmp);
    return true;
}